

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall CSnapIDPool::Reset(CSnapIDPool *this)

{
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    lVar1 = lVar2 + 1;
    this->m_aIDs[lVar2].m_Next = (short)lVar1;
    this->m_aIDs[lVar2].m_State = 0;
    lVar2 = lVar1;
  } while (lVar1 != 0x4000);
  this->m_aIDs[0x3fff].m_Next = -1;
  this->m_FirstFree = 0;
  this->m_FirstTimed = -1;
  this->m_LastTimed = -1;
  this->m_Usage = 0;
  this->m_InUsage = 0;
  return;
}

Assistant:

void CSnapIDPool::Reset()
{
	for(int i = 0; i < MAX_IDS; i++)
	{
		m_aIDs[i].m_Next = i+1;
		m_aIDs[i].m_State = 0;
	}

	m_aIDs[MAX_IDS-1].m_Next = -1;
	m_FirstFree = 0;
	m_FirstTimed = -1;
	m_LastTimed = -1;
	m_Usage = 0;
	m_InUsage = 0;
}